

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

bool __thiscall test_case::eval_grad(test_case *this,ggml_backend_t backend,char *op_name)

{
  pointer *ppfVar1;
  pointer pfVar2;
  pointer pfVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ggml_cgraph *pgVar9;
  undefined4 extraout_var;
  int *piVar10;
  long lVar11;
  undefined8 uVar12;
  undefined4 extraout_var_00;
  int *piVar13;
  ggml_tensor *t;
  double dVar14;
  size_type __new_size;
  ggml_tensor *t_00;
  FILE *pFVar15;
  bool bVar16;
  size_type sVar17;
  char *__format;
  bool bVar18;
  float extraout_XMM0_Da;
  float fVar19;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ggml_context_ptr ctx;
  float fd;
  float fu;
  vector<float,_std::allocator<float>_> gn;
  float fdh;
  float fuh;
  float xid;
  float xidh;
  float xiuh;
  float xiu;
  ggml_backend_buffer_ptr buf;
  vector<float,_std::allocator<float>_> expect;
  vector<float,_std::allocator<float>_> x0;
  _Head_base<0UL,_ggml_context_*,_false> local_120;
  uint local_114;
  double local_110;
  vector<float,_std::allocator<float>_> local_108;
  ggml_backend_t local_e8;
  float local_e0;
  float local_dc;
  vector<float,_std::allocator<float>_> local_d8;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  char *local_90;
  unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> local_88;
  vector<float,_std::allocator<float>_> *local_80;
  long local_78;
  long local_70;
  vector<float,_std::allocator<float>_> local_68;
  double local_50;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  this->mode = MODE_GRAD;
  (*this->_vptr_test_case[10])(&local_80,this);
  lVar7 = ggml_tensor_overhead();
  lVar8 = ggml_graph_overhead_custom(0x800,1);
  local_48 = lVar7 * 0x80 + lVar8 * 2;
  uStack_40 = 0;
  local_38 = 1;
  local_120._M_head_impl = (ggml_context *)ggml_init();
  if (local_120._M_head_impl == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
               ,0x2f7,"GGML_ASSERT(%s) failed","ctx");
  }
  pgVar9 = (ggml_cgraph *)ggml_new_graph_custom(local_120._M_head_impl,0x800,1);
  this->gf = pgVar9;
  pgVar9 = (ggml_cgraph *)ggml_new_graph_custom(local_120._M_head_impl,0x800,1);
  this->gb = pgVar9;
  iVar5 = (*this->_vptr_test_case[4])(this,local_120._M_head_impl);
  piVar13 = (int *)CONCAT44(extraout_var,iVar5);
  if (op_name == (char *)0x0) {
    bVar16 = true;
    if (piVar13[0x14] == 0x51) goto LAB_0011aa18;
  }
  else {
    (*this->_vptr_test_case[2])(&local_108,this,piVar13);
    iVar5 = std::__cxx11::string::compare((char *)&local_108);
    bVar18 = true;
    if (iVar5 == 0) {
      bVar18 = piVar13[0x14] == 0x51;
    }
    if ((pointer *)
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage) {
      operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    bVar16 = true;
    if (bVar18) goto LAB_0011aa18;
  }
  (*this->_vptr_test_case[2])(&local_108,this,piVar13);
  pfVar2 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*this->_vptr_test_case[3])(&local_d8,this);
  printf("  %s(%s): ",pfVar2,
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start);
  if ((pointer *)
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  ppfVar1 = &local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if ((pointer *)
      local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != ppfVar1) {
    operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  fflush(_stdout);
  if (*piVar13 == 0) {
    piVar10 = (int *)ggml_get_first_tensor(local_120._M_head_impl);
    bVar16 = false;
    for (; piVar10 != (int *)0x0;
        piVar10 = (int *)ggml_get_next_tensor(local_120._M_head_impl,piVar10)) {
      cVar4 = ggml_backend_supports_op(backend,piVar10);
      if (cVar4 == '\0') {
        uVar12 = ggml_backend_name(backend);
        printf("not supported [%s] ",uVar12);
        if (bVar16) goto LAB_0011aa0b;
        goto LAB_0011a85c;
      }
      if (((*(byte *)(piVar10 + 0x25) & 4) != 0) && (bVar16 = true, *piVar10 != 0))
      goto LAB_0011a9f3;
    }
    if (!bVar16) {
LAB_0011a85c:
      (*this->_vptr_test_case[2])(&local_108,this,piVar13);
      printf("not supported [%s] \n",
             local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
      if ((pointer *)
          local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != ppfVar1) {
        operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      goto LAB_0011aa0b;
    }
    lVar7 = ggml_get_first_tensor(local_120._M_head_impl);
    lVar8 = 0;
    for (; lVar7 != 0; lVar7 = ggml_get_next_tensor(local_120._M_head_impl,lVar7)) {
      if ((*(byte *)(lVar7 + 0x94) & 4) != 0) {
        lVar11 = ggml_nelements(lVar7);
        lVar8 = lVar8 + lVar11;
      }
    }
    iVar5 = (*this->_vptr_test_case[9])(this);
    if (lVar8 <= CONCAT44(extraout_var_00,iVar5)) {
      cVar4 = ggml_is_scalar(piVar13);
      if (cVar4 == '\0') {
        piVar13 = (int *)ggml_sum(local_120._M_head_impl,piVar13);
        ggml_set_name(piVar13,"sum_of_out");
      }
      ggml_set_loss(piVar13);
      ggml_build_forward_expand(this->gf,piVar13);
      ggml_graph_cpy(this->gf,this->gb);
      ggml_build_backward_expand(local_120._M_head_impl,local_120._M_head_impl,this->gb,0);
      if (((local_78 - (long)local_80 != 4) ||
          (fVar19 = *(float *)&(local_80->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                               .super__Vector_impl_data._M_start, fVar19 != 0.0)) || (NAN(fVar19)))
      {
        iVar5 = ggml_graph_n_nodes(this->gb);
        iVar6 = ggml_graph_n_nodes(this->gf);
        if (iVar5 <= iVar6) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                     ,0x33c,"GGML_ASSERT(%s) failed",
                     "ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf)");
        }
        for (lVar7 = ggml_get_first_tensor(local_120._M_head_impl); lVar7 != 0;
            lVar7 = ggml_get_next_tensor(local_120._M_head_impl,lVar7)) {
          if (((*(byte *)(lVar7 + 0x94) & 4) != 0) &&
             (lVar8 = ggml_graph_get_grad(this->gb,lVar7), *(int *)(lVar8 + 0x50) == 0)) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                       ,0x33e,"GGML_ASSERT(%s) failed",
                       "!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE"
                      );
          }
        }
      }
      for (piVar10 = (int *)ggml_get_first_tensor(local_120._M_head_impl); piVar10 != (int *)0x0;
          piVar10 = (int *)ggml_get_next_tensor(local_120._M_head_impl,piVar10)) {
        cVar4 = ggml_backend_supports_op(backend,piVar10);
        if (cVar4 == '\0') {
          piVar10 = (int *)ggml_backend_name(backend);
          __format = "not supported [%s] ";
          goto LAB_0011aa04;
        }
        if (((*(byte *)(piVar10 + 0x25) & 4) != 0) && (*piVar10 != 0)) goto LAB_0011a9f3;
      }
      local_88._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
      super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl =
           (__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>)
           ggml_backend_alloc_ctx_tensors(local_120._M_head_impl,backend);
      if ((tuple<ggml_backend_buffer_*,_ggml_backend_buffer_deleter>)
          local_88._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
          .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
          super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ggml_backend_buffer_*,_false>)0x0) {
        uVar12 = ggml_backend_name(backend);
        bVar16 = false;
        printf("failed to allocate tensors [%s] ",uVar12);
      }
      else {
        (*this->_vptr_test_case[0xb])(this,local_120._M_head_impl);
        ggml_graph_reset(this->gb);
        iVar5 = ggml_backend_graph_compute(backend,this->gf);
        pFVar15 = _stderr;
        if (iVar5 == 0) {
          iVar5 = ggml_backend_graph_compute(backend,this->gb);
          pFVar15 = _stderr;
          if (iVar5 == 0) {
            t = (ggml_tensor *)ggml_get_first_tensor(local_120._M_head_impl);
            local_114 = (uint)CONCAT71((int7)((ulong)t >> 8),1);
            local_90 = "ggml_is_scalar(out)";
            local_e8 = backend;
            for (; t != (ggml_tensor *)0x0;
                t = (ggml_tensor *)ggml_get_next_tensor(local_120._M_head_impl,t)) {
              if ((t->flags & 4) != 0) {
                dVar14 = (double)ggml_backend_name(backend);
                __new_size = ggml_nelements(t);
                local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (float *)0x0;
                local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                t_00 = (ggml_tensor *)ggml_graph_get_grad(this->gb,t);
                if (t_00 == (ggml_tensor *)0x0) {
                  std::vector<float,_std::allocator<float>_>::resize(&local_108,__new_size);
                }
                else {
                  tensor_to_float(&local_d8,t_00);
                  pfVar3 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                  pfVar2 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (float *)0x0;
                  local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((pfVar2 != (float *)0x0) &&
                     (operator_delete(pfVar2,(long)pfVar3 - (long)pfVar2),
                     local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start != (float *)0x0)) {
                    operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                local_110 = dVar14;
                if (0 < (long)__new_size) {
                  sVar17 = 0;
                  do {
                    if (0x7f7fffff <
                        (uint)ABS(local_108.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start[sVar17])) {
                      uVar12 = ggml_op_desc(t);
                      printf("[%s] nonfinite gradient at index %ld (%s=%f) ",
                             SUB84((double)local_108.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start[sVar17],0),uVar12,
                             sVar17,local_110);
                      iVar5 = 0xe;
                      local_114 = 0;
                      goto LAB_0011afad;
                    }
                    sVar17 = sVar17 + 1;
                  } while (__new_size != sVar17);
                }
                iVar5 = 0xe;
                if ((local_114 & 1) != 0) {
                  std::vector<float,_std::allocator<float>_>::vector
                            (&local_d8,__new_size,(allocator_type *)&local_68);
                  if ((long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start !=
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                               ,0x386,"GGML_ASSERT(%s) failed","ga.size() == gn.size()");
                  }
                  tensor_to_float(&local_68,t);
                  cVar4 = ggml_is_scalar(piVar13);
                  if (cVar4 == '\0') {
                    uVar12 = 0x389;
LAB_0011b1c0:
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                               ,uVar12,"GGML_ASSERT(%s) failed",local_90);
                  }
                  if (*piVar13 != 0) {
                    uVar12 = 0x38a;
                    local_90 = "out->type == GGML_TYPE_F32";
                    goto LAB_0011b1c0;
                  }
                  (*this->_vptr_test_case[7])(this);
                  local_110 = (double)CONCAT44(local_110._4_4_,extraout_XMM0_Da);
                  if (0 < (long)__new_size) {
                    local_ac = extraout_XMM0_Da + extraout_XMM0_Da;
                    local_50 = (double)extraout_XMM0_Da * 6.0;
                    lVar7 = 0;
                    do {
                      local_94 = *(float *)((long)local_68.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar7)
                                 + local_110._0_4_;
                      local_98 = local_110._0_4_ * 0.5 +
                                 *(float *)((long)local_68.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar7);
                      local_9c = local_110._0_4_ * -0.5 +
                                 *(float *)((long)local_68.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar7);
                      local_a0 = *(float *)((long)local_68.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar7)
                                 - local_110._0_4_;
                      ggml_backend_tensor_set(t,&local_94,lVar7,4);
                      iVar5 = ggml_backend_graph_compute(local_e8,this->gf);
                      pFVar15 = _stderr;
                      if (iVar5 != 0) {
                        uVar12 = ggml_status_to_string(iVar5);
LAB_0011b02b:
                        fprintf(pFVar15,"%s: ggml_backend_graph_compute failed. status=%s \n",
                                "eval_grad",uVar12);
                        iVar5 = 1;
                        backend = local_e8;
                        goto LAB_0011af3c;
                      }
                      uVar12 = ggml_nbytes(piVar13);
                      ggml_backend_tensor_get(piVar13,&local_dc,0,uVar12);
                      ggml_backend_tensor_set(t,&local_a0,lVar7,4);
                      iVar5 = ggml_backend_graph_compute(local_e8,this->gf);
                      pFVar15 = _stderr;
                      if (iVar5 != 0) {
                        uVar12 = ggml_status_to_string(iVar5);
                        goto LAB_0011b02b;
                      }
                      uVar12 = ggml_nbytes(piVar13);
                      ggml_backend_tensor_get(piVar13,&local_e0,0,uVar12);
                      iVar5 = (*this->_vptr_test_case[8])(this);
                      if ((char)iVar5 != '\0') {
                        ggml_backend_tensor_set(t,&local_98,lVar7,4);
                        iVar5 = ggml_backend_graph_compute(local_e8,this->gf);
                        pFVar15 = _stderr;
                        if (iVar5 == 0) {
                          uVar12 = ggml_nbytes(piVar13);
                          ggml_backend_tensor_get(piVar13,&local_a4,0,uVar12);
                          ggml_backend_tensor_set(t,&local_9c,lVar7,4);
                          iVar5 = ggml_backend_graph_compute(local_e8,this->gf);
                          pFVar15 = _stderr;
                          if (iVar5 == 0) {
                            uVar12 = ggml_nbytes(piVar13);
                            ggml_backend_tensor_get(piVar13,&local_a8,0,uVar12);
                            fVar19 = (float)((((double)local_a4 * 8.0 + (double)local_e0) -
                                             ((double)local_a8 * 8.0 + (double)local_dc)) / local_50
                                            );
                            goto LAB_0011ae79;
                          }
                          uVar12 = ggml_status_to_string(iVar5);
                        }
                        else {
                          uVar12 = ggml_status_to_string(iVar5);
                        }
                        goto LAB_0011b02b;
                      }
                      fVar19 = (local_dc - local_e0) / local_ac;
LAB_0011ae79:
                      pfVar2 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      *(float *)((long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar7) = fVar19;
                      uVar12 = ggml_nbytes(t);
                      ggml_backend_tensor_set(t,pfVar2,0,uVar12);
                      lVar7 = lVar7 + 4;
                      __new_size = __new_size - 1;
                    } while (__new_size != 0);
                  }
                  local_110 = mean_abs_asymm(local_d8.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start,
                                             local_108.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start,
                                             (long)local_d8.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_d8.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2,
                                             local_80);
                  (*this->_vptr_test_case[6])(this);
                  backend = local_e8;
                  iVar5 = 0;
                  if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da_00) <= local_110 &&
                      local_110 != (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da_00)) {
                    uVar12 = ggml_op_desc(t);
                    (*this->_vptr_test_case[6])(this);
                    printf("[%s] MAA = %.9f > %.9f ",SUB84(local_110,0),
                           CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_01),uVar12);
                    iVar5 = 0xe;
                    local_114 = 0;
                  }
LAB_0011af3c:
                  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (float *)0x0) {
                    operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
LAB_0011afad:
                if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (float *)0x0) {
                  operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_108.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_108.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if (iVar5 != 0) {
                  if (iVar5 != 0xe) {
                    bVar16 = false;
                    goto LAB_0011b10f;
                  }
                  break;
                }
              }
            }
            if ((local_114 & 1) == 0) {
              bVar16 = false;
              printf("compare failed ");
              puts("\x1b[1;31mFAIL\x1b[0m");
            }
            else {
              puts("\x1b[1;32mOK\x1b[0m");
              bVar16 = true;
            }
            goto LAB_0011b10f;
          }
          uVar12 = ggml_status_to_string(iVar5);
        }
        else {
          uVar12 = ggml_status_to_string(iVar5);
        }
        bVar16 = false;
        fprintf(pFVar15,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_grad",uVar12);
      }
LAB_0011b10f:
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr(&local_88);
      goto LAB_0011aa18;
    }
    puts("skipping large tensors for speed ");
  }
  else {
    printf("not supported [%s->type != FP32]\n",piVar13 + 0x40);
  }
  goto LAB_0011aa15;
LAB_0011a9f3:
  piVar10 = piVar10 + 0x40;
  __format = "not supported [%s->type != FP32] ";
LAB_0011aa04:
  printf(__format,piVar10);
LAB_0011aa0b:
  putchar(10);
LAB_0011aa15:
  bVar16 = true;
LAB_0011aa18:
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_120);
  if (local_80 != (vector<float,_std::allocator<float>_> *)0x0) {
    operator_delete(local_80,local_70 - (long)local_80);
  }
  return bVar16;
}

Assistant:

bool eval_grad(ggml_backend_t backend, const char * op_name) {
        mode = MODE_GRAD;
        const std::vector<float> expect = grad_expect();

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + 2*ggml_graph_overhead_custom(GGML_DEFAULT_GRAPH_SIZE, true),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        gf = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);
        gb = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);

        ggml_tensor * out = build_graph(ctx.get());

        if ((op_name != nullptr && op_desc(out) != op_name) || out->op == GGML_OP_OPT_STEP_ADAMW) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        if (out->type != GGML_TYPE_F32) {
            printf("not supported [%s->type != FP32]\n", out->name);
            return true;
        }

        // check if the backend supports the ops
        bool supported = true;
        bool any_params = false;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM)) {
                any_params = true;
                if (t->type != GGML_TYPE_F32) {
                    printf("not supported [%s->type != FP32] ", t->name);
                    supported = false;
                    break;
                }
            }
        }
        if (!any_params) {
            printf("not supported [%s] \n", op_desc(out).c_str());
            supported = false;
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        int64_t ngrads = 0;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (t->flags & GGML_TENSOR_FLAG_PARAM) {
                ngrads += ggml_nelements(t);
            }
        }
        if (ngrads > grad_nmax()) {
            printf("skipping large tensors for speed \n");
            return true;
        }


        if (!ggml_is_scalar(out)) {
            out = ggml_sum(ctx.get(), out);
            ggml_set_name(out, "sum_of_out");
        }
        ggml_set_loss(out);

        ggml_build_forward_expand(gf, out);
        ggml_graph_cpy(gf, gb);
        ggml_build_backward_expand(ctx.get(), ctx.get(), gb, false);
        if (expect.size() != 1 || expect[0] != 0.0f) {
            GGML_ASSERT(ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf));
            for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
                GGML_ASSERT(!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE);
            }
        }

        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM) && t->type != GGML_TYPE_F32) {
                printf("not supported [%s->type != FP32] ", t->name);
                supported = false;
                break;
            }
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr
        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend));
            return false;
        }

        initialize_tensors(ctx.get()); // Randomizes all tensors (including gradients).
        ggml_graph_reset(gb);    // Sets gradients to 1 if loss, 0 otherwise.

        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }
        status = ggml_backend_graph_compute(backend, gb);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        bool ok = true;
        for (struct ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != nullptr; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!(t->flags & GGML_TENSOR_FLAG_PARAM)) {
                continue;
            }

            const char * bn = ggml_backend_name(backend);
            const int64_t ne = ggml_nelements(t);

            std::vector<float> ga;
            struct ggml_tensor * grad = ggml_graph_get_grad(gb, t);
            if (grad) {
                ga = tensor_to_float(grad);
            } else {
                ga.resize(ne); // default value is 0.0f
            }

            for (int64_t i = 0; i < ne; ++i) { // gradient algebraic
                // check for nans
                if (!std::isfinite(ga[i])) {
                    printf("[%s] nonfinite gradient at index %" PRId64 " (%s=%f) ", ggml_op_desc(t), i, bn, ga[i]);
                    ok = false;
                    break;
                }
            }
            if (!ok) {
                break;
            }

            std::vector<float> gn(ne); // gradient numeric
            GGML_ASSERT(ga.size() == gn.size());

            std::vector<float> x0 = tensor_to_float(t); // original t data
            GGML_ASSERT(ggml_is_scalar(out));
            GGML_ASSERT(out->type == GGML_TYPE_F32);

            const float eps = grad_eps();
            for (int64_t i = 0; i < ne; ++i) {
                const float xiu  = x0[i] + 1.0f*eps; // x, index i, up
                const float xiuh = x0[i] + 0.5f*eps; // x, index i, up half
                const float xidh = x0[i] - 0.5f*eps; // x, index i, down half
                const float xid  = x0[i] - 1.0f*eps; // x, index i, down

                float fu, fuh, fdh, fd; // output values for xiu, xiuh, xid, xidh

                ggml_backend_tensor_set(t, &xiu, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fu, 0, ggml_nbytes(out));

                ggml_backend_tensor_set(t, &xid, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fd, 0, ggml_nbytes(out));

                if (grad_precise()) {
                    ggml_backend_tensor_set(t, &xiuh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fuh, 0, ggml_nbytes(out));

                    ggml_backend_tensor_set(t, &xidh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fdh, 0, ggml_nbytes(out));

                    gn[i] = (8.0*(double)fuh + (double)fd - (8.0*(double)fdh + (double)fu)) / (6.0*(double)eps);
                } else {
                    gn[i] = (fu - fd) / (2.0f*eps);
                }

                ggml_backend_tensor_set(t, x0.data(), 0, ggml_nbytes(t));
            }

            const double err = mean_abs_asymm(gn.data(), ga.data(), gn.size(), expect);
            if (err > max_maa_err()) {
                printf("[%s] MAA = %.9f > %.9f ", ggml_op_desc(t), err, max_maa_err());
                ok = false;
                break;
            }
            if (!ok) {
                break;
            }
        }

        if (!ok) {
            printf("compare failed ");
        }

        if (ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }